

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.h
# Opt level: O0

void __thiscall irr::gui::CGUIImage::checkBounds(CGUIImage *this,rect<int> *rect)

{
  s32 sVar1;
  rect<int> *in_RSI;
  f32 clipHeight;
  f32 clipWidth;
  
  core::rect<int>::getWidth(in_RSI);
  core::rect<int>::getHeight(in_RSI);
  sVar1 = core::round32(0.0);
  (in_RSI->UpperLeftCorner).X = sVar1 + (in_RSI->UpperLeftCorner).X;
  sVar1 = core::round32(0.0);
  (in_RSI->UpperLeftCorner).Y = sVar1 + (in_RSI->UpperLeftCorner).Y;
  sVar1 = core::round32(0.0);
  (in_RSI->LowerRightCorner).X = (in_RSI->LowerRightCorner).X - sVar1;
  sVar1 = core::round32(0.0);
  (in_RSI->LowerRightCorner).Y = (in_RSI->LowerRightCorner).Y - sVar1;
  return;
}

Assistant:

void checkBounds(core::rect<s32> &rect)
	{
		f32 clipWidth = (f32)rect.getWidth();
		f32 clipHeight = (f32)rect.getHeight();

		rect.UpperLeftCorner.X += core::round32(DrawBounds.UpperLeftCorner.X * clipWidth);
		rect.UpperLeftCorner.Y += core::round32(DrawBounds.UpperLeftCorner.Y * clipHeight);
		rect.LowerRightCorner.X -= core::round32((1.f - DrawBounds.LowerRightCorner.X) * clipWidth);
		rect.LowerRightCorner.Y -= core::round32((1.f - DrawBounds.LowerRightCorner.Y) * clipHeight);
	}